

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O0

void __thiscall
irr::scene::SViewFrustum::setFrom(SViewFrustum *this,matrix4 *mat,bool zClipFromZero)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  byte in_DL;
  CMatrix4<float> *in_RSI;
  long in_RDI;
  f32 fVar4;
  f32 len;
  u32 i;
  undefined4 local_18;
  
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,3);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0);
  *(float *)(in_RDI + 0x2c) = fVar1 + *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,7);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,4);
  *(float *)(in_RDI + 0x30) = fVar1 + *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xb);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,8);
  *(float *)(in_RDI + 0x34) = fVar1 + *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xf);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xc);
  *(float *)(in_RDI + 0x38) = fVar1 + *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,3);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0);
  *(float *)(in_RDI + 0x3c) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,7);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,4);
  *(float *)(in_RDI + 0x40) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xb);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,8);
  *(float *)(in_RDI + 0x44) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xf);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xc);
  *(float *)(in_RDI + 0x48) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,3);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,1);
  *(float *)(in_RDI + 0x5c) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,7);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,5);
  *(float *)(in_RDI + 0x60) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xb);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,9);
  *(float *)(in_RDI + 100) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xf);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xd);
  *(float *)(in_RDI + 0x68) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,3);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,1);
  *(float *)(in_RDI + 0x4c) = fVar1 + *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,7);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,5);
  *(float *)(in_RDI + 0x50) = fVar1 + *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xb);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,9);
  *(float *)(in_RDI + 0x54) = fVar1 + *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xf);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xd);
  *(float *)(in_RDI + 0x58) = fVar1 + *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,3);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,2);
  *(float *)(in_RDI + 0xc) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,7);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,6);
  *(float *)(in_RDI + 0x10) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xb);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,10);
  *(float *)(in_RDI + 0x14) = fVar1 - *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xf);
  fVar1 = *pfVar2;
  pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xe);
  *(float *)(in_RDI + 0x18) = fVar1 - *pfVar2;
  if ((in_DL & 1) == 0) {
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,3);
    fVar1 = *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,2);
    *(float *)(in_RDI + 0x1c) = fVar1 + *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,7);
    fVar1 = *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,6);
    *(float *)(in_RDI + 0x20) = fVar1 + *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xb);
    fVar1 = *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,10);
    *(float *)(in_RDI + 0x24) = fVar1 + *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xf);
    fVar1 = *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xe);
    *(float *)(in_RDI + 0x28) = fVar1 + *pfVar2;
  }
  else {
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,2);
    *(float *)(in_RDI + 0x1c) = *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,6);
    *(float *)(in_RDI + 0x20) = *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,10);
    *(float *)(in_RDI + 0x24) = *pfVar2;
    pfVar2 = core::CMatrix4<float>::operator[](in_RSI,0xe);
    *(float *)(in_RDI + 0x28) = *pfVar2;
  }
  for (local_18 = 0; local_18 != 6; local_18 = local_18 + 1) {
    core::vector3d<float>::getLengthSQ((vector3d<float> *)(in_RDI + 0xc + (ulong)local_18 * 0x10));
    fVar4 = core::reciprocal_squareroot(0.0);
    core::vector3d<float>::operator*=
              ((vector3d<float> *)(in_RDI + 0xc + (ulong)local_18 * 0x10),-(float)fVar4);
    lVar3 = in_RDI + 0xc + (ulong)local_18 * 0x10;
    *(float *)(lVar3 + 0xc) = -(float)fVar4 * *(float *)(lVar3 + 0xc);
  }
  recalculateBoundingBox(this);
  return;
}

Assistant:

inline void SViewFrustum::setFrom(const core::matrix4 &mat, bool zClipFromZero)
{
	// left clipping plane
	planes[VF_LEFT_PLANE].Normal.X = mat[3] + mat[0];
	planes[VF_LEFT_PLANE].Normal.Y = mat[7] + mat[4];
	planes[VF_LEFT_PLANE].Normal.Z = mat[11] + mat[8];
	planes[VF_LEFT_PLANE].D = mat[15] + mat[12];

	// right clipping plane
	planes[VF_RIGHT_PLANE].Normal.X = mat[3] - mat[0];
	planes[VF_RIGHT_PLANE].Normal.Y = mat[7] - mat[4];
	planes[VF_RIGHT_PLANE].Normal.Z = mat[11] - mat[8];
	planes[VF_RIGHT_PLANE].D = mat[15] - mat[12];

	// top clipping plane
	planes[VF_TOP_PLANE].Normal.X = mat[3] - mat[1];
	planes[VF_TOP_PLANE].Normal.Y = mat[7] - mat[5];
	planes[VF_TOP_PLANE].Normal.Z = mat[11] - mat[9];
	planes[VF_TOP_PLANE].D = mat[15] - mat[13];

	// bottom clipping plane
	planes[VF_BOTTOM_PLANE].Normal.X = mat[3] + mat[1];
	planes[VF_BOTTOM_PLANE].Normal.Y = mat[7] + mat[5];
	planes[VF_BOTTOM_PLANE].Normal.Z = mat[11] + mat[9];
	planes[VF_BOTTOM_PLANE].D = mat[15] + mat[13];

	// far clipping plane
	planes[VF_FAR_PLANE].Normal.X = mat[3] - mat[2];
	planes[VF_FAR_PLANE].Normal.Y = mat[7] - mat[6];
	planes[VF_FAR_PLANE].Normal.Z = mat[11] - mat[10];
	planes[VF_FAR_PLANE].D = mat[15] - mat[14];

	// near clipping plane
	if (zClipFromZero) {
		planes[VF_NEAR_PLANE].Normal.X = mat[2];
		planes[VF_NEAR_PLANE].Normal.Y = mat[6];
		planes[VF_NEAR_PLANE].Normal.Z = mat[10];
		planes[VF_NEAR_PLANE].D = mat[14];
	} else {
		// near clipping plane
		planes[VF_NEAR_PLANE].Normal.X = mat[3] + mat[2];
		planes[VF_NEAR_PLANE].Normal.Y = mat[7] + mat[6];
		planes[VF_NEAR_PLANE].Normal.Z = mat[11] + mat[10];
		planes[VF_NEAR_PLANE].D = mat[15] + mat[14];
	}

	// normalize normals
	u32 i;
	for (i = 0; i != VF_PLANE_COUNT; ++i) {
		const f32 len = -core::reciprocal_squareroot(
				planes[i].Normal.getLengthSQ());
		planes[i].Normal *= len;
		planes[i].D *= len;
	}

	// make bounding box
	recalculateBoundingBox();
}